

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.h
# Opt level: O0

ostream * filesystem::operator<<(ostream *os,path *path)

{
  undefined1 local_38 [40];
  path *path_local;
  ostream *os_local;
  
  local_38._32_8_ = path;
  path_local = (path *)os;
  filesystem::path::str_abi_cxx11_((path *)local_38,(path_type)path);
  std::operator<<(os,(string *)local_38);
  std::__cxx11::string::~string((string *)local_38);
  return (ostream *)path_local;
}

Assistant:

std::ostream &operator<<(std::ostream &os, const path &path) {
        os << path.str();
        return os;
    }